

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
Hpipe::Lexer::flags_abi_cxx11_
          (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  pointer pcVar1;
  char cVar2;
  istream *piVar3;
  Lexem *pLVar4;
  string line;
  istringstream is;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  long local_1b0 [15];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar4 = (this->first_item).next;
  if (pLVar4 != (Lexem *)0x0) {
    do {
      if (pLVar4->type == FLAGS) {
        pcVar1 = (pLVar4->str)._M_dataplus._M_p;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_1f0,pcVar1 + 9,pcVar1 + ((pLVar4->str)._M_string_length - 10));
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_1b0,(string *)&local_1f0,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
LAB_001773e6:
        while( true ) {
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                                  (char)(istringstream *)local_1b0);
          piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_1b0,(string *)&local_1f0,cVar2);
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
          while (local_1f0._M_string_length != 0) {
            if ((*local_1f0._M_dataplus._M_p != '\t') && (*local_1f0._M_dataplus._M_p != ' '))
            goto LAB_00177473;
            std::__cxx11::string::substr((ulong)local_1d0,(ulong)&local_1f0);
            std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1d0);
            if (local_1d0[0] != local_1c0) {
              operator_delete(local_1d0[0],local_1c0[0] + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
      }
      pLVar4 = pLVar4->next;
    } while (pLVar4 != (Lexem *)0x0);
  }
  return __return_storage_ptr__;
  while (std::__cxx11::string::pop_back(), local_1f0._M_string_length != 0) {
LAB_00177473:
    if ((local_1f0._M_dataplus._M_p[local_1f0._M_string_length - 1] != ' ') &&
       (local_1f0._M_dataplus._M_p[local_1f0._M_string_length - 1] != '\t')) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_1f0);
      break;
    }
  }
  goto LAB_001773e6;
}

Assistant:

Vec<std::string> Lexer::flags() const {
    Vec<std::string> res;
    for( const Lexem *item = root(); item ; item = item->next ) {
        if ( item->type == Lexem::FLAGS ) {
            std::istringstream is( std::string( item->str.begin() + sizeof( "beg_flags" ) - 1, item->str.end() - sizeof( "end_flags" ) ) );
            std::string line;
            while ( std::getline( is, line ) ) {
                // trim
                while ( line.size() && ( line.front() == ' ' || line.front() == '\t' ) )
                    line = line.substr( 1 );
                while ( line.size() && ( line.back() == ' ' || line.back() == '\t' ) )
                    line.pop_back();
                // register
                if ( line.size() )
                    res << line;
            }
        }
    }
    return res;
}